

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O1

LOs __thiscall Omega_h::offset_scan<signed_char>(Omega_h *this,Read<signed_char> *a,string *name)

{
  int *piVar1;
  char *pcVar2;
  undefined8 uVar3;
  long *plVar4;
  Alloc **ppAVar5;
  void *extraout_RDX;
  Alloc *pAVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  LOs LVar10;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> out;
  string __str;
  ScopedTimer local_c9;
  Write<int> local_c8;
  Alloc local_b8;
  Alloc **local_70;
  long local_68;
  Alloc *local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar5 = (Alloc **)(plVar4 + 2);
  if ((Alloc **)*plVar4 == ppAVar5) {
    local_60 = *ppAVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *ppAVar5;
    local_70 = (Alloc **)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)ppAVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ppAVar5 = &local_b8.prev;
  local_b8.ptr = ppAVar5;
  std::__cxx11::string::_M_construct((ulong)&local_b8.ptr,'\x02');
  *(undefined2 *)local_b8.ptr = 0x3231;
  pAVar6 = (Alloc *)0xf;
  if (local_70 != &local_60) {
    pAVar6 = local_60;
  }
  if (pAVar6 < (Alloc *)(local_b8._48_8_ + local_68)) {
    pAVar6 = (Alloc *)0xf;
    if ((Alloc **)local_b8.ptr != ppAVar5) {
      pAVar6 = local_b8.prev;
    }
    if ((Alloc *)(local_b8._48_8_ + local_68) <= pAVar6) {
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_b8.ptr,0,(char *)0x0,(ulong)local_70);
      goto LAB_002f1e2d;
    }
  }
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b8.ptr);
LAB_002f1e2d:
  local_c8.shared_alloc_.alloc = &local_b8;
  pAVar6 = (Alloc *)(plVar4 + 2);
  if ((Alloc *)*plVar4 == pAVar6) {
    local_b8.size = pAVar6->size;
    local_b8.name._M_dataplus._M_p = (pointer)plVar4[3];
  }
  else {
    local_b8.size = pAVar6->size;
    local_c8.shared_alloc_.alloc = (Alloc *)*plVar4;
  }
  local_c8.shared_alloc_.direct_ptr = (void *)plVar4[1];
  *plVar4 = (long)pAVar6;
  plVar4[1] = 0;
  *(undefined1 *)&pAVar6->size = 0;
  begin_code("offset_scan",(char *)local_c8.shared_alloc_.alloc);
  if (local_c8.shared_alloc_.alloc != &local_b8) {
    operator_delete(local_c8.shared_alloc_.alloc,local_b8.size + 1);
  }
  if ((Alloc **)local_b8.ptr != ppAVar5) {
    operator_delete(local_b8.ptr,(ulong)((long)&(local_b8.prev)->size + 1));
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,(ulong)((long)&local_60->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar6 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar6 & 1) == 0) {
    iVar9 = (int)pAVar6->size;
  }
  else {
    iVar9 = (int)((ulong)pAVar6 >> 3);
  }
  Write<int>::Write(&local_c8,iVar9 + 1,name);
  Write<int>::set(&local_c8,0,0);
  pAVar6 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar6 & 1) == 0) {
    sVar7 = pAVar6->size;
  }
  else {
    sVar7 = (ulong)pAVar6 >> 3;
  }
  if (0 < (long)(int)sVar7) {
    pcVar2 = (char *)(a->write_).shared_alloc_.direct_ptr;
    iVar9 = (int)*pcVar2;
    *(int *)((long)local_c8.shared_alloc_.direct_ptr + 4) = iVar9;
    if ((sVar7 & 0xffffffff) != 1) {
      lVar8 = 0;
      do {
        iVar9 = iVar9 + pcVar2[lVar8 + 1];
        *(int *)((long)local_c8.shared_alloc_.direct_ptr + lVar8 * 4 + 8) = iVar9;
        lVar8 = lVar8 + 1;
      } while ((long)(int)sVar7 + -1 != lVar8);
    }
  }
  local_b8.name.field_2._M_allocated_capacity = (size_type)local_c8.shared_alloc_.alloc;
  local_b8.name.field_2._8_8_ = local_c8.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
       local_c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + -1;
    local_b8.name.field_2._M_allocated_capacity = (local_c8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_c8.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_b8.name.field_2);
  uVar3 = local_b8.name.field_2._M_allocated_capacity;
  if ((local_b8.name.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_b8.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_b8.name.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_b8.name.field_2._M_allocated_capacity);
      operator_delete((void *)uVar3,0x48);
    }
  }
  pAVar6 = local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_c9);
  LVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar10.write_.shared_alloc_;
}

Assistant:

LOs offset_scan(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  Write<LO> out(a.size() + 1, name);
  out.set(0, 0);
  auto const first = CastIterator<LO, T>(a.begin());
  auto const last = CastIterator<LO, T>(a.end());
  auto const result = out.begin() + 1;
  inclusive_scan(first, last, result);
  return out;
}